

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_disk_directory_traversals.c
# Opt level: O3

void test_basic(char *compression_type)

{
  int iVar1;
  mode_t mVar2;
  void *buff;
  archive *paVar3;
  time_t tVar4;
  long lVar5;
  char *pcVar6;
  ssize_t sVar7;
  int64_t iVar8;
  size_t used;
  archive_entry *ae;
  char filedata [64];
  size_t local_88;
  archive_entry *local_80;
  undefined1 local_78 [72];
  
  buff = malloc(1000);
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'+',(uint)(paVar3 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_7zip(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L',',0,"ARCHIVE_OK",(long)iVar1,"archive_write_set_format_7zip(a)",paVar3);
  if (compression_type != (char *)0x0) {
    iVar1 = archive_write_set_format_option(paVar3,"7zip","compression",compression_type);
    if (iVar1 != 0) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                     ,L'0');
      test_skipping("%s writing not fully supported on this platform",compression_type);
      iVar1 = archive_write_free(paVar3);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                          ,L'2',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
      free(buff);
      return;
    }
  }
  iVar1 = archive_write_add_filter_none(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'6',0,"ARCHIVE_OK",(long)iVar1,"archive_write_add_filter_none(a)",paVar3);
  iVar1 = archive_write_open_memory(paVar3,buff,1000,&local_88);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'8',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_write_open_memory(a, buff, buffsize, &used)",paVar3);
  local_80 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'=',(uint)(local_80 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(local_80,1,10);
  tVar4 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'?',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'@',10,"10",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname(local_80,"empty");
  pcVar6 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'B',"empty","\"empty\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode(local_80,0x81ed);
  mVar2 = archive_entry_mode(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'D',0x81ed,"(AE_IFREG | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar1 = archive_write_header(paVar3,local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'F',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(local_80);
  local_80 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'L',(uint)(local_80 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(local_80,1,10);
  tVar4 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'N',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'O',10,"10",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname(local_80,"empty2");
  pcVar6 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'Q',"empty2","\"empty2\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode(local_80,0x8124);
  mVar2 = archive_entry_mode(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'S',0x8124,"(AE_IFREG | 0444)",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar1 = archive_write_header(paVar3,local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'U',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(local_80);
  local_80 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'[',(uint)(local_80 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(local_80,1,100);
  tVar4 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L']',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'^',100,"100",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname(local_80,"file");
  pcVar6 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'`',"file","\"file\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode(local_80,0x81ed);
  mVar2 = archive_entry_mode(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'b',0x81ed,"(AE_IFREG | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  archive_entry_set_size(local_80,8);
  iVar1 = archive_write_header(paVar3,local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'e',0,"0",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(local_80);
  sVar7 = archive_write_data(paVar3,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'g',8,"8",sVar7,"archive_write_data(a, \"12345678\", 9)",(void *)0x0);
  sVar7 = archive_write_data(paVar3,"1",1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'h',0,"0",sVar7,"archive_write_data(a, \"1\", 1)",(void *)0x0);
  local_80 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'm',(uint)(local_80 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(local_80,1,10);
  tVar4 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'o',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'p',10,"10",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname(local_80,"file2");
  pcVar6 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'r',"file2","\"file2\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode(local_80,0x81ed);
  mVar2 = archive_entry_mode(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L't',0x81ed,"(AE_IFREG | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  archive_entry_set_size(local_80,4);
  iVar1 = archive_write_header(paVar3,local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'w',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  archive_entry_free(local_80);
  sVar7 = archive_write_data(paVar3,"1234",5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'y',4,"4",sVar7,"archive_write_data(a, \"1234\", 5)",(void *)0x0);
  local_80 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'~',(uint)(local_80 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(local_80,1,10);
  tVar4 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'\x80',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'\x81',10,"10",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  archive_entry_copy_pathname(local_80,"symbolic");
  archive_entry_copy_symlink(local_80,"file1");
  pcVar6 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'\x84',"symbolic","\"symbolic\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  archive_entry_set_mode(local_80,0xa1ed);
  mVar2 = archive_entry_mode(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'\x86',0xa1ed,"(AE_IFLNK | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar1 = archive_write_header(paVar3,local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'\x88',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0)
  ;
  archive_entry_free(local_80);
  local_80 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'\x8e',(uint)(local_80 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(local_80,0xb,100);
  archive_entry_copy_pathname(local_80,"dir");
  archive_entry_set_mode(local_80,0x41ed);
  archive_entry_set_size(local_80,0x200);
  iVar1 = archive_write_header(paVar3,local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'\x94',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
  failure("size should be zero so that applications know not to write");
  iVar8 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'\x96',0,"0",iVar8,"archive_entry_size(ae)",(void *)0x0);
  archive_entry_free(local_80);
  sVar7 = archive_write_data(paVar3,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'\x98',0,"0",sVar7,"archive_write_data(a, \"12345678\", 9)",paVar3);
  local_80 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'\x9d',(uint)(local_80 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(local_80,0xb,200);
  archive_entry_copy_pathname(local_80,"dir/subdir");
  archive_entry_set_mode(local_80,0x41ed);
  archive_entry_set_size(local_80,0x200);
  iVar1 = archive_write_header(paVar3,local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'£',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
  failure("size should be zero so that applications know not to write");
  iVar8 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'¥',0,"0",iVar8,"archive_entry_size(ae)",(void *)0x0);
  archive_entry_free(local_80);
  sVar7 = archive_write_data(paVar3,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'§',0,"0",sVar7,"archive_write_data(a, \"12345678\", 9)",paVar3);
  local_80 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'¬',(uint)(local_80 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(local_80,0xb,300);
  archive_entry_copy_pathname(local_80,"dir/subdir/subdir");
  archive_entry_set_mode(local_80,0x41ed);
  archive_entry_set_size(local_80,0x200);
  iVar1 = archive_write_header(paVar3,local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'²',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",paVar3);
  failure("size should be zero so that applications know not to write");
  iVar8 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'´',0,"0",iVar8,"archive_entry_size(ae)",(void *)0x0);
  archive_entry_free(local_80);
  sVar7 = archive_write_data(paVar3,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'¶',0,"0",sVar7,"archive_write_data(a, \"12345678\", 9)",paVar3);
  iVar1 = archive_write_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'¹',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",(void *)0x0);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'º',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'½',buff,"buff",anon_var_dwarf_c5fca,
                      "\"\\x37\\x7a\\xbc\\xaf\\x27\\x1c\\x00\\x03\"",8,"8",(void *)0x0);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                   ,L'Ã',(uint)(paVar3 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ä',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",paVar3)
  ;
  iVar1 = archive_read_support_filter_all(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Å',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar3)
  ;
  iVar1 = read_open_memory_seek(paVar3,buff,local_88,7);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Æ',0,"ARCHIVE_OK",(long)iVar1,"read_open_memory_seek(a, buff, used, 7)",
                      paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ë',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar4 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ì',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Í',100,"100",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Î',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ï',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'Ð',"file","\"file\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ñ',0x81ed,"AE_IFREG | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar8 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ò',8,"8",iVar8,"archive_entry_size(ae)",(void *)0x0);
  sVar7 = archive_read_data(paVar3,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ô',8,"8",sVar7,"archive_read_data(a, filedata, sizeof(filedata))",paVar3);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Õ',local_78,"filedata","12345678","\"12345678\"",8,"8",(void *)0x0);
  iVar1 = archive_read_next_header(paVar3,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Û',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar4 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ü',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ý',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Þ',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ß',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'à',"file2","\"file2\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'á',0x81ed,"AE_IFREG | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar8 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'â',4,"4",iVar8,"archive_entry_size(ae)",(void *)0x0);
  sVar7 = archive_read_data(paVar3,local_78,0x40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ä',4,"4",sVar7,"archive_read_data(a, filedata, sizeof(filedata))",paVar3);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'å',local_78,"filedata","1234","\"1234\"",4,"4",(void *)0x0);
  iVar1 = archive_read_next_header(paVar3,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ê',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar4 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ë',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ì',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'í',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'î',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'ï',"symbolic","\"symbolic\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
  ;
  pcVar6 = archive_entry_symlink(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'ð',"file1","\"file1\"",pcVar6,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ñ',0xa1ed,"AE_IFLNK | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar8 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ò',0,"0",iVar8,"archive_entry_size(ae)",(void *)0x0);
  iVar1 = archive_read_next_header(paVar3,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'÷',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar4 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ø',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ù',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ú',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'û',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'ü',"empty","\"empty\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ý',0x81ed,"AE_IFREG | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar8 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'þ',0,"0",iVar8,"archive_entry_size(ae)",(void *)0x0);
  iVar1 = archive_read_next_header(paVar3,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ă',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar4 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ą',1,"1",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ą',0,"0",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ć',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ć',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'Ĉ',"empty2","\"empty2\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ĉ',0x8124,"AE_IFREG | 0444",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar8 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ċ',0,"0",iVar8,"archive_entry_size(ae)",(void *)0x0);
  iVar1 = archive_read_next_header(paVar3,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ď',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar4 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Đ',0xb,"11",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'đ',300,"300",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ē',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ē',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'Ĕ',"dir/subdir/subdir/","\"dir/subdir/subdir/\"",pcVar6,
             "archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ĕ',0x41ed,"AE_IFDIR | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar8 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ė',0,"0",iVar8,"archive_entry_size(ae)",(void *)0x0);
  sVar7 = archive_read_data(paVar3,local_78,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ė',0,"0",sVar7,"archive_read_data(a, filedata, 10)",paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ĝ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar4 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ĝ',0xb,"11",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ğ',200,"200",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ğ',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ġ',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'ġ',"dir/subdir/","\"dir/subdir/\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  mVar2 = archive_entry_mode(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ģ',0x41ed,"AE_IFDIR | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar8 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ģ',0,"0",iVar8,"archive_entry_size(ae)",(void *)0x0);
  sVar7 = archive_read_data(paVar3,local_78,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ĥ',0,"0",sVar7,"archive_read_data(a, filedata, 10)",paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ĩ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  tVar4 = archive_entry_mtime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ī',0xb,"11",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_mtime_nsec(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ī',100,"100",lVar5,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  tVar4 = archive_entry_atime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ĭ',0,"0",tVar4,"archive_entry_atime(ae)",(void *)0x0);
  tVar4 = archive_entry_ctime(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ĭ',0,"0",tVar4,"archive_entry_ctime(ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(local_80);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
             ,L'Į',"dir/","\"dir/\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar2 = archive_entry_mode(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'į',0x41ed,"AE_IFDIR | 0755",(ulong)mVar2,"archive_entry_mode(ae)",
                      (void *)0x0);
  iVar8 = archive_entry_size(local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'İ',0,"0",iVar8,"archive_entry_size(ae)",(void *)0x0);
  sVar7 = archive_read_data(paVar3,local_78,10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ı',0,"0",sVar7,"archive_read_data(a, filedata, 10)",paVar3);
  iVar1 = archive_read_next_header(paVar3,&local_80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ĵ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",paVar3);
  iVar1 = archive_filter_code(paVar3,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ķ',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",paVar3)
  ;
  iVar1 = archive_format(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ĸ',0xe0000,"ARCHIVE_FORMAT_7ZIP",(long)iVar1,"archive_format(a)",paVar3);
  iVar1 = archive_read_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'ĺ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_7zip.c"
                      ,L'Ļ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  free(buff);
  return;
}

Assistant:

static void
test_basic(void)
{
	struct archive *a;
	struct archive_entry *ae;
	const void *p;
	char *initial_cwd, *cwd;
	size_t size;
	int64_t offset;
	int file_count;
#if defined(_WIN32) && !defined(__CYGWIN__)
	wchar_t *wcwd, *wp, *fullpath;
#endif

	assertMakeDir("dir1", 0755);
	assertMakeFile("dir1/file1", 0644, "0123456789");
	assertMakeFile("dir1/file2", 0644, "hello world");
	assertMakeDir("dir1/sub1", 0755);
	assertMakeFile("dir1/sub1/file1", 0644, "0123456789");
	assertMakeDir("dir1/sub2", 0755);
	assertMakeFile("dir1/sub2/file1", 0644, "0123456789");
	assertMakeFile("dir1/sub2/file2", 0644, "0123456789");
	assertMakeDir("dir1/sub2/sub1", 0755);
	assertMakeDir("dir1/sub2/sub2", 0755);
	assertMakeDir("dir1/sub2/sub3", 0755);
	assertMakeFile("dir1/sub2/sub3/file", 0644, "xyz");
	file_count = 12;

	assert((ae = archive_entry_new()) != NULL);
	assert((a = archive_read_disk_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, "dir1"));

	while (file_count--) {
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
		if (strcmp(archive_entry_pathname(ae), "dir1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/file1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 10);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 10);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "0123456789", 10);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 10);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/file2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 11);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 11);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "hello world", 11);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 11);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub1/file1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 10);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 10);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "0123456789", 10);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 10);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub2/file1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 10);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 10);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "0123456789", 10);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 10);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub2/file2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 10);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 10);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "0123456789", 10);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 10);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub2/sub1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub2/sub2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub2/sub3") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub2/sub3/file") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 3);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 3);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "xyz", 3);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 3);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		}
		if (archive_entry_filetype(ae) == AE_IFDIR) {
			/* Descend into the current object */
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_disk_descend(a));
		}
	}
	/* There is no entry. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header2(a, ae));

	/* Close the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));

	/*
	 * Test that call archive_read_disk_open_w, wchar_t version.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open_w(a, L"dir1"));

	file_count = 12;
	while (file_count--) {
		assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
		if (wcscmp(archive_entry_pathname_w(ae), L"dir1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/file1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 10);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 10);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "0123456789", 10);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 10);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/file2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 11);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 11);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "hello world", 11);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 11);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/sub1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/sub1/file1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 10);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 10);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "0123456789", 10);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 10);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/sub2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/sub2/file1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 10);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 10);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "0123456789", 10);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 10);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/sub2/file2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 10);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 10);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "0123456789", 10);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 10);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/sub2/sub1") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/sub2/sub2") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/sub2/sub3") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);
			assertEqualInt(1, archive_read_disk_can_descend(a));
		} else if (wcscmp(archive_entry_pathname_w(ae),
		    L"dir1/sub2/sub3/file") == 0) {
			assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
			assertEqualInt(archive_entry_size(ae), 3);
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 3);
			assertEqualInt((int)offset, 0);
			assertEqualMem(p, "xyz", 3);
			assertEqualInt(ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
			assertEqualInt((int)offset, 3);
			assertEqualInt(0, archive_read_disk_can_descend(a));
		}
		if (archive_entry_filetype(ae) == AE_IFDIR) {
			/* Descend into the current object */
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_disk_descend(a));
		}
	}
	/* There is no entry. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header2(a, ae));

	/* Close the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));

	/*
	 * Test that call archive_read_disk_open with a regular file.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, "dir1/file1"));

	/* dir1/file1 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
	assertEqualInt(0, archive_read_disk_can_descend(a));
	assertEqualString(archive_entry_pathname(ae), "dir1/file1");
	assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
	assertEqualInt(archive_entry_size(ae), 10);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt((int)size, 10);
	assertEqualInt((int)offset, 0);
	assertEqualMem(p, "0123456789", 10);

	/* There is no entry. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header2(a, ae));

	/* Close the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));


#if defined(_WIN32) && !defined(__CYGWIN__)
	/*
	 * Test for wildcard '*' or '?'
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, "dir1/*1"));

	/* dir1/file1 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
	assertEqualInt(0, archive_read_disk_can_descend(a));
	assertEqualString(archive_entry_pathname(ae), "dir1/file1");
	assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
	assertEqualInt(archive_entry_size(ae), 10);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt((int)size, 10);
	assertEqualInt((int)offset, 0);
	assertEqualMem(p, "0123456789", 10);

	/* dir1/sub1 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
	assertEqualInt(1, archive_read_disk_can_descend(a));
	assertEqualString(archive_entry_pathname(ae), "dir1/sub1");
	assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);

	/* Descend into the current object */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_descend(a));

	/* dir1/sub1/file1 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
	assertEqualInt(0, archive_read_disk_can_descend(a));
	assertEqualString(archive_entry_pathname(ae), "dir1/sub1/file1");
	assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
	assertEqualInt(archive_entry_size(ae), 10);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt((int)size, 10);
	assertEqualInt((int)offset, 0);
	assertEqualMem(p, "0123456789", 10);

	/* There is no entry. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header2(a, ae));

	/* Close the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));

	/*
	 * Test for a full-path beginning with "//?/"
	 */
	wcwd = _wgetcwd(NULL, 0);
	fullpath = malloc(sizeof(wchar_t) * (wcslen(wcwd) + 32));
	wcscpy(fullpath, L"//?/");
	wcscat(fullpath, wcwd);
	wcscat(fullpath, L"/dir1/file1");
	free(wcwd);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open_w(a, fullpath));
	while ((wcwd = wcschr(fullpath, L'\\')) != NULL)
		*wcwd = L'/';

	/* dir1/file1 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
	assertEqualInt(0, archive_read_disk_can_descend(a));
	assertEqualWString(archive_entry_pathname_w(ae), fullpath);
	assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
	assertEqualInt(archive_entry_size(ae), 10);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt((int)size, 10);
	assertEqualInt((int)offset, 0);
	assertEqualMem(p, "0123456789", 10);

	/* There is no entry. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header2(a, ae));

	/* Close the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	free(fullpath);

	/*
	 * Test for wild card '*' or '?' with "//?/" prefix.
	 */
	wcwd = _wgetcwd(NULL, 0);
	fullpath = malloc(sizeof(wchar_t) * (wcslen(wcwd) + 32));
	wcscpy(fullpath, L"//?/");
	wcscat(fullpath, wcwd);
	wcscat(fullpath, L"/dir1/*1");
	free(wcwd);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open_w(a, fullpath));
	while ((wcwd = wcschr(fullpath, L'\\')) != NULL)
		*wcwd = L'/';

	/* dir1/file1 */
	wp = wcsrchr(fullpath, L'/');
	wcscpy(wp+1, L"file1");
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
	assertEqualInt(0, archive_read_disk_can_descend(a));
	assertEqualWString(archive_entry_pathname_w(ae), fullpath);
	assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
	assertEqualInt(archive_entry_size(ae), 10);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt((int)size, 10);
	assertEqualInt((int)offset, 0);
	assertEqualMem(p, "0123456789", 10);

	/* dir1/sub1 */
	wcscpy(wp+1, L"sub1");
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
	assertEqualInt(1, archive_read_disk_can_descend(a));
	assertEqualWString(archive_entry_pathname_w(ae), fullpath);
	assertEqualInt(archive_entry_filetype(ae), AE_IFDIR);

	/* Descend into the current object */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_descend(a));

	/* dir1/sub1/file1 */
	wcscpy(wp+1, L"sub1/file1");
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));
	assertEqualInt(0, archive_read_disk_can_descend(a));
	assertEqualWString(archive_entry_pathname_w(ae), fullpath);
	assertEqualInt(archive_entry_filetype(ae), AE_IFREG);
	assertEqualInt(archive_entry_size(ae), 10);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt((int)size, 10);
	assertEqualInt((int)offset, 0);
	assertEqualMem(p, "0123456789", 10);

	/* There is no entry. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header2(a, ae));

	/* Close the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	free(fullpath);

#endif

	/*
	 * We should be on the initial directory where we performed
	 * archive_read_disk_new() after we perfome archive_read_free()
	 *  even if we broke off the directory traversals.
	 */

	/* Save current working directory. */
#ifdef PATH_MAX
	initial_cwd = getcwd(NULL, PATH_MAX);/* Solaris getcwd needs the size. */
#else
	initial_cwd = getcwd(NULL, 0);
#endif

	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, "dir1"));

	/* Step in a deep directory. */
	file_count = 12;
	while (file_count--) {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_next_header2(a, ae));
		if (strcmp(archive_entry_pathname(ae),
		    "dir1/sub1/file1") == 0)
			/*
			 * We are on an another directory at this time.
			 */
			break;
		if (archive_entry_filetype(ae) == AE_IFDIR) {
			/* Descend into the current object */
			assertEqualIntA(a, ARCHIVE_OK,
			    archive_read_disk_descend(a));
		}
	}
	/* Destroy the disk object. */
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/* We should be on the initial working directory. */
	failure(
	    "Current working directory does not return to the initial"
	    "directory");
#ifdef PATH_MAX
	cwd = getcwd(NULL, PATH_MAX);/* Solaris getcwd needs the size. */
#else
	cwd = getcwd(NULL, 0);
#endif
	assertEqualString(initial_cwd, cwd);
	free(initial_cwd);
	free(cwd);

	archive_entry_free(ae);
}